

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrands.cpp
# Opt level: O3

void __thiscall getRands::userandfile(getRands *this)

{
  pointer pfVar1;
  FILE *__stream;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  undefined8 extraout_RAX;
  uint in_ECX;
  int extraout_EDX;
  rd_option rVar5;
  char *this_00;
  getRands *this_01;
  FILE *unaff_R14;
  ulong unaff_R15;
  value_type_conflict vStack_3c;
  getRands *pgStack_38;
  FILE *pFStack_30;
  ulong uStack_28;
  
  this_00 = "static/random.bin";
  rVar5 = 0x10b21e;
  __stream = fopen("static/random.bin","rb");
  if (__stream == (FILE *)0x0) {
    userandfile();
  }
  else {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    this->buffersize_ = (uint)(uVar2 >> 2);
    fseek(__stream,0,0);
    unaff_R15 = (ulong)this->buffersize_;
    this_00 = (char *)operator_new__(unaff_R15 * 4);
    this->buf_ = (OASIS_FLOAT *)this_00;
    rVar5 = 4;
    sVar3 = fread(this_00,4,unaff_R15,__stream);
    in_ECX = this->buffersize_;
    unaff_R14 = __stream;
    if (sVar3 == in_ECX) {
      fclose(__stream);
      return;
    }
  }
  userandfile();
  ((getRands *)this_00)->buf_ = (OASIS_FLOAT *)0x0;
  this_01 = (getRands *)0x0;
  pgStack_38 = this;
  pFStack_30 = unaff_R14;
  uStack_28 = unaff_R15;
  uVar2 = time((time_t *)0x0);
  uVar2 = uVar2 & 0xffffffff;
  (((getRands *)this_00)->gen_)._M_x[0] = uVar2;
  lVar4 = 4;
  do {
    uVar2 = (ulong)((((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar4) - 3);
    (((getRands *)this_00)->gen_)._M_x[lVar4 + -3] = uVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x273);
  (((getRands *)this_00)->gen_)._M_p = 0x270;
  *(undefined4 *)&(((getRands *)this_00)->dis_)._M_param._M_a = 0;
  *(undefined4 *)((long)&(((getRands *)this_00)->dis_)._M_param._M_a + 4) = 0;
  *(undefined4 *)&(((getRands *)this_00)->dis_)._M_param._M_b = 0;
  *(undefined4 *)((long)&(((getRands *)this_00)->dis_)._M_param._M_b + 4) = 0x3ff00000;
  ((getRands *)this_00)->rand_vec_size_ = extraout_EDX;
  ((getRands *)this_00)->rand_seed_ = in_ECX;
  (((getRands *)this_00)->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((getRands *)this_00)->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((getRands *)this_00)->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)in_ECX) {
    uVar2 = (ulong)in_ECX;
    (((getRands *)this_00)->gen_)._M_x[0] = uVar2;
    lVar4 = 4;
    do {
      uVar2 = (ulong)((((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar4) - 3);
      (((getRands *)this_00)->gen_)._M_x[lVar4 + -3] = uVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x273);
    (((getRands *)this_00)->gen_)._M_p = 0x270;
  }
  ((getRands *)this_00)->rndopt_ = rVar5;
  ((getRands *)this_00)->base_offset_ = 0;
  if (rVar5 == usecachedvector) {
    std::vector<float,_std::allocator<float>_>::resize
              (&((getRands *)this_00)->rnd_,(long)extraout_EDX,&vStack_3c);
  }
  else if (rVar5 != usehashedseed) {
    if (rVar5 != userandomnumberfile) {
      getRands(this_01);
      pfVar1 = (((getRands *)this_00)->rnd_).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pfVar1 != (pointer)0x0) {
        operator_delete(pfVar1);
      }
      _Unwind_Resume(extraout_RAX);
    }
    userandfile((getRands *)this_00);
  }
  return;
}

Assistant:

void getRands::userandfile()
{
	FILE *fin = fopen(RANDOM_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, RANDOM_FILE);
		exit(-1);
	}
	flseek(fin, 0L, SEEK_END);
	long long p = fltell(fin);
	buffersize_ = p / sizeof(OASIS_FLOAT);
	//		_buffersize = _buffersize - 1;		// first 4 bytes is the limit
	fseek(fin, 0L, SEEK_SET);

	buf_ = new OASIS_FLOAT[buffersize_];
	if (fread(buf_, sizeof(OASIS_FLOAT), buffersize_, fin) != buffersize_) {
		fprintf(stderr, "FATAL: %s: Error reading random number file\n", __func__);
		exit(-1);
	}
	fclose(fin);
}